

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void finishgencycle(lua_State *L,global_State *g)

{
  global_State *g_local;
  lua_State *L_local;
  
  correctgraylists(g);
  checkSizes(L,g);
  g->gcstate = '\0';
  if (g->gcemergency == '\0') {
    callallpendingfinalizers(L);
  }
  return;
}

Assistant:

static void finishgencycle (lua_State *L, global_State *g) {
  correctgraylists(g);
  checkSizes(L, g);
  g->gcstate = GCSpropagate;  /* skip restart */
  if (!g->gcemergency)
    callallpendingfinalizers(L);
}